

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O0

void generate_page_map(QPDF *qpdf)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  QPDFObjGen local_88;
  reference local_80;
  QPDFPageObjectHelper *page;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_58 [24];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_40;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  undefined1 local_30 [4];
  int n;
  QPDFPageDocumentHelper dh;
  QPDF *qpdf_local;
  
  dh.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)qpdf;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_30,qpdf);
  __range1._4_4_ = 0;
  QPDFPageDocumentHelper::getAllPages();
  local_40 = local_58;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_40)
  ;
  page = (QPDFPageObjectHelper *)
         std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                *)&page);
    if (!bVar1) break;
    local_80 = __gnu_cxx::
               __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
               ::operator*(&__end1);
    iVar2 = __range1._4_4_ + 1;
    __range1._4_4_ = iVar2;
    local_88 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)(local_80 + 8));
    pmVar3 = std::
             map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
             ::operator[](&page_map,&local_88);
    *pmVar3 = iVar2;
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_58);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_30);
  return;
}

Assistant:

void
generate_page_map(QPDF& qpdf)
{
    QPDFPageDocumentHelper dh(qpdf);
    int n = 0;
    for (auto const& page: dh.getAllPages()) {
        page_map[page] = ++n;
    }
}